

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O2

void testrand_seed(uchar *seed16)

{
  long lVar1;
  uint64_t uVar2;
  uchar *puVar3;
  int j;
  long lVar4;
  uchar out32 [32];
  secp256k1_sha256 local_78;
  
  puVar3 = out32;
  local_78.s[0] = 0x6a09e667;
  local_78.s[1] = 0xbb67ae85;
  local_78.s[2] = 0x3c6ef372;
  local_78.s[3] = 0xa54ff53a;
  local_78.s[4] = 0x510e527f;
  local_78.s[5] = 0x9b05688c;
  local_78.s[6] = 0x1f83d9ab;
  local_78.s[7] = 0x5be0cd19;
  local_78.bytes = 0;
  secp256k1_sha256_write(&local_78,"secp256k1 test init",0x13);
  secp256k1_sha256_write(&local_78,seed16,0x10);
  secp256k1_sha256_finalize(&local_78,out32);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    uVar2 = 0;
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      uVar2 = uVar2 << 8 | (ulong)puVar3[lVar4];
    }
    secp256k1_test_state[lVar1] = uVar2;
    puVar3 = puVar3 + 8;
  }
  return;
}

Assistant:

SECP256K1_INLINE static void testrand_seed(const unsigned char *seed16) {
    static const unsigned char PREFIX[] = {'s', 'e', 'c', 'p', '2', '5', '6', 'k', '1', ' ', 't', 'e', 's', 't', ' ', 'i', 'n', 'i', 't'};
    unsigned char out32[32];
    secp256k1_sha256 hash;
    int i;

    /* Use SHA256(PREFIX || seed16) as initial state. */
    secp256k1_sha256_initialize(&hash);
    secp256k1_sha256_write(&hash, PREFIX, sizeof(PREFIX));
    secp256k1_sha256_write(&hash, seed16, 16);
    secp256k1_sha256_finalize(&hash, out32);
    for (i = 0; i < 4; ++i) {
        uint64_t s = 0;
        int j;
        for (j = 0; j < 8; ++j) s = (s << 8) | out32[8*i + j];
        secp256k1_test_state[i] = s;
    }
}